

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<unsigned_char,false>
               (char *buf,idx_t len,uchar *result,bool strict)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  uint in_R9D;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  IntegerCastData<short> local_6a;
  IntegerDecimalCastData<unsigned_char> local_68;
  ulong local_48;
  uchar *local_40;
  ulong local_38;
  
  if (len != 0) {
    iVar9 = 3;
    iVar13 = 1;
    uVar5 = 0;
    do {
      bVar2 = buf[uVar5];
      in_R9D = bVar2 - 9;
      if ((4 < in_R9D) && (bVar2 != 0x20)) {
        if (bVar2 == 0x2d) {
          uVar15 = len - uVar5;
          uVar12 = 1;
          goto LAB_001ec26e;
        }
        if (bVar2 != 0x30 || len - 1 == uVar5) {
LAB_001ec43b:
          uVar15 = len - uVar5;
          local_48 = (ulong)(bVar2 == 0x2b);
          bVar2 = 0;
          bVar8 = 0;
          uVar12 = local_48;
          goto LAB_001ec455;
        }
        cVar7 = buf[uVar5 + 1];
        if (cVar7 != 'B') {
          if (cVar7 != 'x') {
            if (cVar7 == 'b') goto LAB_001ec732;
            if (cVar7 != 'X') goto LAB_001ec43b;
          }
          bVar2 = 0;
          bVar8 = 0;
          uVar12 = 1;
          goto LAB_001ec33b;
        }
LAB_001ec732:
        uVar12 = ~uVar5 + len;
        bVar19 = 1 < uVar12;
        if (!bVar19) {
          bVar2 = 0;
          goto LAB_001ec290;
        }
        uVar15 = 1;
        bVar2 = 0;
        goto LAB_001ec749;
      }
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
  }
  bVar2 = (byte)in_R9D;
  bVar19 = false;
  goto LAB_001ec290;
  while (lVar3 = uVar5 + uVar12, uVar12 = uVar12 + 1, buf[lVar3] == '0') {
LAB_001ec26e:
    if (uVar15 <= uVar12) {
      bVar2 = 0;
      uVar12 = 1;
      goto LAB_001ec54b;
    }
  }
  bVar2 = 0;
LAB_001ec288:
  bVar19 = false;
  goto LAB_001ec290;
  while( true ) {
    uVar16 = uVar12 + 1;
    bVar18 = true;
    if ((~uVar12 + len != uVar5) && (buf[uVar5 + 1 + uVar12] == '_')) {
      uVar16 = uVar12 + 2;
      if ((len - uVar12) - 2 == uVar5) {
        bVar18 = false;
      }
      else {
        bVar18 = (byte)(buf[uVar5 + uVar16] - 0x30U) < 10;
      }
    }
    bVar2 = bVar2 * '\n' - bVar8;
    bVar19 = false;
    uVar12 = uVar16;
    if (!bVar18) break;
LAB_001ec54b:
    if (uVar15 <= uVar12) goto LAB_001eccf5;
    bVar8 = buf[uVar5 + uVar12] - 0x30;
    if (9 < bVar8) {
      if (buf[uVar5 + uVar12] == '.') {
        uVar16 = uVar12 + 1;
        if (uVar16 < uVar15) {
          iVar9 = 0;
          if (9 < (byte)(buf[uVar5 + 1 + uVar12] - 0x30U)) goto LAB_001ecc8c;
          iVar13 = 1;
        }
        else {
          iVar9 = 3;
LAB_001ecc8c:
          iVar13 = 1;
          if (1 < uVar12) {
            iVar13 = iVar9;
          }
        }
        uVar12 = uVar16;
        if (iVar13 == 3) goto LAB_001eccf5;
        if (iVar13 != 0) goto LAB_001ec288;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar5 + uVar12] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar12] & 0x3f) & 1) != 0)) {
        uVar16 = uVar12 + 1;
        uVar12 = uVar16;
        if (uVar15 <= uVar16) goto LAB_001eccf5;
        goto LAB_001eccce;
      }
      break;
    }
  }
  goto LAB_001ec290;
  while (uVar16 = uVar16 + 1, uVar12 = uVar15, uVar15 != uVar16) {
LAB_001eccce:
    if ((0x20 < (ulong)(byte)buf[uVar5 + uVar16]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar16] & 0x3f) & 1) == 0)) goto LAB_001ec288;
  }
LAB_001eccf5:
  bVar19 = 1 < uVar12;
  goto LAB_001ec290;
  while( true ) {
    uVar16 = uVar12 + 1;
    if ((byte)(0x2fU - cVar7) / 10 < bVar8) {
      bVar18 = false;
    }
    else {
      bVar2 = (cVar7 - 0x30U) + bVar8 * '\n';
      bVar18 = true;
      bVar8 = bVar2;
      if ((~uVar12 + len != uVar5) && (buf[uVar5 + 1 + uVar12] == '_')) {
        uVar16 = uVar12 + 2;
        if ((len - uVar12) - 2 == uVar5) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar5 + uVar16] - 0x30U) < 10;
        }
      }
    }
    bVar19 = false;
    uVar12 = uVar16;
    if (!bVar18) break;
LAB_001ec455:
    if (uVar15 <= uVar12) goto LAB_001ec9ff;
    cVar7 = buf[uVar5 + uVar12];
    if (9 < (byte)(cVar7 - 0x30U)) {
      if (cVar7 == '.') {
        uVar16 = uVar12 + 1;
        if (((uVar15 <= uVar16) || (iVar9 = 0, 9 < (byte)(buf[uVar5 + 1 + uVar12] - 0x30U))) &&
           (local_48 < uVar12)) {
          iVar13 = iVar9;
        }
        uVar12 = uVar16;
        if (iVar13 == 3) goto LAB_001ec9ff;
        if (iVar13 != 0) goto LAB_001ec288;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar5 + uVar12] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar12] & 0x3f) & 1) != 0)) {
        uVar16 = uVar12 + 1;
        uVar12 = uVar16;
        if (uVar15 <= uVar16) goto LAB_001ec9ff;
        goto LAB_001ec9d8;
      }
      break;
    }
  }
  goto LAB_001ec290;
  while (uVar16 = uVar16 + 1, uVar12 = uVar15, uVar15 != uVar16) {
LAB_001ec9d8:
    if ((0x20 < (ulong)(byte)buf[uVar5 + uVar16]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar16] & 0x3f) & 1) == 0)) goto LAB_001ec288;
  }
LAB_001ec9ff:
  bVar19 = local_48 < uVar12;
  goto LAB_001ec290;
LAB_001ec33b:
  do {
    if (~uVar5 + len <= uVar12) goto LAB_001eccf5;
    bVar1 = buf[uVar5 + 1 + uVar12];
    bVar14 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar14 = bVar1;
    }
    if (9 < (byte)(bVar14 - 0x30)) {
      bVar19 = false;
      if ((0x25 < bVar14 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar14 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar7 = -0x57;
    if ((char)bVar14 < 'a') {
      cVar7 = -0x30;
    }
    uVar15 = uVar12 + 1;
    if (((len - uVar12) - 2 == uVar5) || (buf[uVar5 + 2 + uVar12] != '_')) {
LAB_001ec404:
      bVar18 = bVar8 <= (byte)~(cVar7 + bVar14) >> 4;
      if (bVar18) {
        bVar8 = cVar7 + bVar14 + bVar8 * '\x10';
        bVar2 = bVar8;
      }
    }
    else {
      uVar15 = uVar12 + 2;
      if ((len - uVar12) - 3 != uVar5) {
        if (9 < (byte)(buf[uVar5 + 3 + uVar12] - 0x30U)) {
          bVar18 = false;
          uVar10 = (byte)buf[uVar5 + 3 + uVar12] - 0x41;
          if ((0x25 < uVar10) || ((0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_001ec42b;
        }
        goto LAB_001ec404;
      }
      bVar18 = false;
    }
LAB_001ec42b:
    bVar19 = false;
    uVar12 = uVar15;
  } while (bVar18);
  goto LAB_001ec290;
  while (lVar3 = uVar5 + uVar15, uVar15 = uVar15 + 1, buf[lVar3] == '0') {
LAB_001ec529:
    if (uVar12 <= uVar15) {
      local_68.result = 0;
      uVar15 = 1;
      goto LAB_001ec8ea;
    }
  }
  goto LAB_001ec2ca;
  while( true ) {
    bVar2 = buf[uVar5 + uVar15] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar5 + uVar15] != '.') goto LAB_001ece6f;
      uVar16 = uVar15 + 1;
      if (uVar12 <= uVar16) {
        iVar9 = 3;
        uVar17 = uVar16;
        goto LAB_001ece49;
      }
      local_68.decimal = 0;
      uVar4 = uVar16;
      goto LAB_001ecbfc;
    }
    uVar16 = uVar15 + 1;
    if (local_68.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar19 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar2;
      bVar19 = true;
      if ((~uVar15 + len != uVar5) && (buf[uVar5 + 1 + uVar15] == '_')) {
        uVar16 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar5) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar5 + uVar16] - 0x30U) < 10;
        }
      }
    }
    uVar15 = uVar16;
    if (!bVar19) break;
LAB_001ec8ea:
    if (uVar12 <= uVar15) goto LAB_001ecbb2;
  }
  goto LAB_001ec2c8;
  while (uVar4 = uVar17, uVar17 < uVar12) {
LAB_001ecbfc:
    bVar2 = buf[uVar5 + uVar4] - 0x30;
    local_48 = uVar16;
    if (9 < bVar2) {
      iVar9 = 0;
      goto LAB_001ece3a;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar17 = uVar4 + 1;
    if (((~uVar4 + len != uVar5) && (buf[uVar5 + 1 + uVar4] == '_')) &&
       ((uVar17 = uVar4 + 2, (len - uVar4) - 2 == uVar5 || (9 < (byte)(buf[uVar5 + uVar17] - 0x30U))
        ))) {
      local_68._18_6_ = 0;
      iVar13 = 1;
      goto LAB_001ece5e;
    }
  }
  iVar9 = 3;
LAB_001ece3a:
  local_68._18_6_ = 0;
  uVar17 = uVar4;
LAB_001ece49:
  iVar13 = 1;
  if (uVar16 < uVar17) {
    iVar13 = iVar9;
  }
  if (1 < uVar15) {
    iVar13 = iVar9;
  }
LAB_001ece5e:
  uVar15 = uVar17;
  if (iVar13 == 3) {
LAB_001ecbb2:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_68);
    if (bVar19) {
      bVar19 = 1 < uVar15;
      goto LAB_001ec2ca;
    }
  }
  else if (iVar13 == 0) {
LAB_001ece6f:
    bVar2 = buf[uVar5 + uVar15];
    if (bVar2 - 9 < 5) {
LAB_001ece81:
      uVar16 = uVar15 + 1;
      uVar15 = uVar16;
      if (uVar16 < uVar12) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar5 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_001ec2c8;
          uVar16 = uVar16 + 1;
          uVar15 = uVar12;
        } while (uVar12 != uVar16);
      }
      goto LAB_001ecbb2;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar15 != 1) && (uVar15 + 1 < uVar12)) {
        local_6a.result = 0;
        pcVar11 = buf + uVar5 + uVar15 + 1;
        iVar6 = ~uVar5 + (len - uVar15);
        if (*pcVar11 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                             (&local_68,local_6a.result);
          goto LAB_001ec2ca;
        }
      }
    }
    else if (bVar2 == 0x20) goto LAB_001ece81;
  }
  goto LAB_001ec2c8;
  while( true ) {
    bVar2 = buf[uVar5 + uVar15] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar5 + uVar15] != '.') goto LAB_001ecd8b;
      uVar16 = uVar15 + 1;
      if (uVar12 <= uVar16) {
        iVar9 = 3;
        uVar17 = uVar16;
        goto LAB_001ecd64;
      }
      local_68.decimal = 0;
      uVar4 = uVar16;
      goto LAB_001ecb1a;
    }
    uVar16 = uVar15 + 1;
    bVar19 = false;
    if (local_68.result <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar2;
      bVar19 = true;
      if ((~uVar15 + len != uVar5) && (buf[uVar5 + 1 + uVar15] == '_')) {
        uVar16 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar5) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar5 + uVar16] - 0x30U) < 10;
        }
      }
    }
    uVar15 = uVar16;
    if (!bVar19) break;
LAB_001ec818:
    if (uVar12 <= uVar15) goto LAB_001eca13;
  }
  goto LAB_001ec2c8;
  while (uVar4 = uVar17, uVar17 < uVar12) {
LAB_001ecb1a:
    bVar2 = buf[uVar5 + uVar4] - 0x30;
    local_38 = uVar16;
    if (9 < bVar2) {
      iVar9 = 0;
      goto LAB_001ecd54;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar17 = uVar4 + 1;
    if (((~uVar4 + len != uVar5) && (buf[uVar5 + 1 + uVar4] == '_')) &&
       ((uVar17 = uVar4 + 2, (len - uVar4) - 2 == uVar5 || (9 < (byte)(buf[uVar5 + uVar17] - 0x30U))
        ))) {
      local_68._18_6_ = 0;
      iVar13 = 1;
      goto LAB_001ecd7a;
    }
  }
  iVar9 = 3;
LAB_001ecd54:
  local_68._18_6_ = 0;
  uVar17 = uVar4;
LAB_001ecd64:
  iVar13 = 1;
  if (uVar16 < uVar17) {
    iVar13 = iVar9;
  }
  if (local_48 < uVar15) {
    iVar13 = iVar9;
  }
LAB_001ecd7a:
  uVar15 = uVar17;
  if (iVar13 == 3) {
LAB_001eca13:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
    if (bVar19) {
      bVar19 = local_48 < uVar15;
      goto LAB_001ec2ca;
    }
  }
  else if (iVar13 == 0) {
LAB_001ecd8b:
    bVar2 = buf[uVar5 + uVar15];
    if (bVar2 - 9 < 5) {
LAB_001ecd9d:
      uVar16 = uVar15 + 1;
      uVar15 = uVar16;
      if (uVar16 < uVar12) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar5 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar5 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_001ec2c8;
          uVar16 = uVar16 + 1;
          uVar15 = uVar12;
        } while (uVar12 != uVar16);
      }
      goto LAB_001eca13;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar15 != local_48) && (uVar15 + 1 < uVar12)) {
        local_6a.result = 0;
        pcVar11 = buf + uVar5 + uVar15 + 1;
        iVar6 = ~uVar5 + (len - uVar15);
        if (*pcVar11 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar11,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                             (&local_68,local_6a.result);
          goto LAB_001ec2ca;
        }
      }
    }
    else if (bVar2 == 0x20) goto LAB_001ecd9d;
  }
  goto LAB_001ec2c8;
LAB_001ec628:
  do {
    if (~uVar5 + len <= uVar12) {
      bVar19 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
      bVar19 = 1 < uVar12 && bVar19;
      goto LAB_001ec2ca;
    }
    bVar2 = buf[uVar5 + 1 + uVar12];
    bVar8 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar8 = bVar2;
    }
    if ((9 < (byte)(bVar8 - 0x30)) &&
       ((0x25 < bVar8 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar8 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar7 = -0x57;
    if ((char)bVar8 < 'a') {
      cVar7 = -0x30;
    }
    uVar15 = uVar12 + 1;
    if (((len - uVar12) - 2 == uVar5) || (buf[uVar5 + 2 + uVar12] != '_')) {
LAB_001ec6ef:
      uVar12 = (ulong)((byte)(cVar7 + bVar8) >> 4) ^ 0x7ffffffffffffff;
      lVar3 = local_68.result;
      if (local_68.result <= (long)uVar12) {
        lVar3 = local_68.result * 0x10 + (ulong)(byte)(cVar7 + bVar8);
      }
      bVar19 = local_68.result <= (long)uVar12;
      local_68.result = lVar3;
    }
    else {
      uVar15 = uVar12 + 2;
      if ((len - uVar12) - 3 != uVar5) {
        if (9 < (byte)(buf[uVar5 + 3 + uVar12] - 0x30U)) {
          uVar10 = (byte)buf[uVar5 + 3 + uVar12] - 0x41;
          bVar19 = false;
          if ((0x25 < uVar10) ||
             (bVar19 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_001ec713;
        }
        goto LAB_001ec6ef;
      }
      bVar19 = false;
    }
LAB_001ec713:
    uVar12 = uVar15;
  } while (bVar19);
  goto LAB_001ec2c8;
  while( true ) {
    uVar15 = uVar4;
    if (0x3fffffffffffffff < local_68.result) goto LAB_001ec2c8;
    local_68.result = uVar16 + local_68.result * 2;
    if (uVar12 <= uVar15) break;
LAB_001eca5b:
    if (buf[uVar5 + 1 + uVar15] == '0') {
      uVar16 = 0;
    }
    else {
      uVar16 = 1;
      if (buf[uVar5 + 1 + uVar15] != '1') goto LAB_001ec2c8;
    }
    uVar4 = uVar15 + 1;
    if (((len - uVar15) - 2 != uVar5) && (buf[uVar5 + 2 + uVar15] == '_')) {
      if (((len - uVar15) - 3 == uVar5) || ((buf[uVar5 + 3 + uVar15] & 0xfeU) != 0x30))
      goto LAB_001ec2c8;
      uVar4 = uVar15 + 2;
    }
  }
LAB_001ecad5:
  bVar19 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
  bVar19 = bVar19 && 1 < uVar12;
  goto LAB_001ec2ca;
LAB_001ec749:
  do {
    bVar8 = 0;
    if (buf[uVar5 + 1 + uVar15] != '0') {
      if (buf[uVar5 + 1 + uVar15] == '1') {
        bVar8 = 1;
        goto LAB_001ec767;
      }
LAB_001ecb9f:
      bVar19 = false;
      break;
    }
LAB_001ec767:
    uVar16 = uVar15 + 1;
    if (((len - uVar15) - 2 != uVar5) && (buf[uVar5 + 2 + uVar15] == '_')) {
      if (((len - uVar15) - 3 == uVar5) || ((buf[uVar5 + 3 + uVar15] & 0xfeU) != 0x30))
      goto LAB_001ecb9f;
      uVar16 = uVar15 + 2;
    }
    uVar15 = uVar16;
    if ((char)bVar2 < '\0') goto LAB_001ecb9f;
    bVar2 = bVar8 | bVar2 * '\x02';
    bVar19 = true;
  } while (uVar15 < uVar12);
LAB_001ec290:
  if (bVar19) {
    *result = bVar2;
    bVar19 = true;
  }
  else {
    local_40 = result;
    if (len != 0) {
      uVar5 = 0;
      do {
        bVar2 = buf[uVar5];
        if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar12 = len - uVar5;
          local_68.decimal_digits = 0;
          if (bVar2 == 0x2d) {
            bVar19 = false;
            uVar15 = 1;
            goto LAB_001ec529;
          }
          if (bVar2 != 0x30 || len - 1 == uVar5) {
LAB_001ec805:
            local_48 = (ulong)(bVar2 == 0x2b);
            local_68.result = 0;
            uVar15 = local_48;
            goto LAB_001ec818;
          }
          cVar7 = buf[uVar5 + 1];
          if (cVar7 != 'B') {
            if (cVar7 != 'x') {
              if (cVar7 == 'b') goto LAB_001eca32;
              if (cVar7 != 'X') goto LAB_001ec805;
            }
            local_68.result = 0;
            uVar12 = 1;
            goto LAB_001ec628;
          }
LAB_001eca32:
          uVar12 = ~uVar5 + len;
          if (uVar12 < 2) goto LAB_001ecad5;
          local_68.result = 0;
          uVar15 = 1;
          goto LAB_001eca5b;
        }
        uVar5 = uVar5 + 1;
      } while (len != uVar5);
    }
LAB_001ec2c8:
    bVar19 = false;
LAB_001ec2ca:
    if (bVar19 != false) {
      *local_40 = (uchar)local_68.result;
    }
  }
  return bVar19;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}